

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeComputeTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::exceed_uniform_block_limit
               (NegativeTestContext *ctx)

{
  RenderContext *renderCtx;
  ostream *poVar1;
  long lVar2;
  ostringstream shaderDecl;
  ShaderProgram program;
  ostringstream shaderBody;
  string local_538;
  string local_518;
  string local_4f8;
  uint local_4d8;
  value_type local_4d0;
  undefined1 local_4b0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0 [4];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_420;
  undefined1 local_400 [32];
  undefined1 local_3e0 [376];
  ShaderProgram local_268;
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e0);
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_3e0,"layout(std140, binding = 0) uniform Block\n",0x2a);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3e0,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_3e0,"    highp vec4 val;\n",0x14);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3e0,"} block[",8);
  local_268.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  glu::CallLogWrapper::glGetIntegerv(&ctx->super_CallLogWrapper,0x91bb,(GLint *)&local_268);
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (local_3e0,
                      (int)local_268.m_shaders[0].
                           super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
                           .super__Vector_impl_data._M_start + 1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"];\n",3);
  renderCtx = ctx->m_renderCtx;
  memset(local_4b0,0,0xac);
  local_400._0_8_ = (pointer)0x0;
  local_400[8] = 0;
  local_400._9_7_ = 0;
  local_400[0x10] = 0;
  local_400._17_8_ = 0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  generateComputeShader(&local_538,(NegativeTestContext *)ctx->m_renderCtx,&local_4f8,&local_518);
  local_4d8 = 5;
  local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4d0,local_538._M_dataplus._M_p,
             local_538._M_dataplus._M_p + local_538._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_4b0 + (ulong)local_4d8 * 0x18),&local_4d0);
  glu::ShaderProgram::ShaderProgram(&local_268,renderCtx,(ProgramSources *)local_4b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
    operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_538._M_dataplus._M_p != &local_538.field_2) {
    operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_518._M_dataplus._M_p != &local_518.field_2) {
    operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
    operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_400);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_420);
  lVar2 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_4b0 + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  local_4b0._0_8_ = local_4a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4b0,
             "Link error is generated if a compute shader exceeds GL_MAX_COMPUTE_UNIFORM_BLOCKS.",""
            );
  NegativeTestContext::beginSection(ctx,(string *)local_4b0);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4b0._0_8_ !=
      local_4a0) {
    operator_delete((void *)local_4b0._0_8_,(ulong)(local_4a0[0]._M_dataplus._M_p + 1));
  }
  verifyLinkError(ctx,&local_268);
  NegativeTestContext::endSection(ctx);
  glu::ShaderProgram::~ShaderProgram(&local_268);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3e0);
  std::ios_base::~ios_base((ios_base *)(local_3e0 + 0x70));
  return;
}

Assistant:

void exceed_uniform_block_limit (NegativeTestContext& ctx)
{
	std::ostringstream shaderDecl;
	std::ostringstream shaderBody;

	shaderDecl	<< "layout(std140, binding = 0) uniform Block\n"
				<< "{\n"
				<< "    highp vec4 val;\n"
				<< "} block[" << getResourceLimit(ctx, GL_MAX_COMPUTE_UNIFORM_BLOCKS) + 1 << "];\n";

	glu::ShaderProgram	program(ctx.getRenderContext(), glu::ProgramSources()
			<< glu::ComputeSource(generateComputeShader(ctx, shaderDecl.str(), shaderBody.str())));

	ctx.beginSection("Link error is generated if a compute shader exceeds GL_MAX_COMPUTE_UNIFORM_BLOCKS.");
	verifyLinkError(ctx, program);
	ctx.endSection();
}